

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  int64 iVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  int64 iVar5;
  undefined4 extraout_var_00;
  uint8 *ptr;
  int64 iVar6;
  undefined4 extraout_var_01;
  byte bVar7;
  LogFinisher local_89;
  string local_88;
  LogMessage local_68;
  ulong value;
  
  iVar3 = (*this->_vptr_MessageLite[0xb])();
  value = CONCAT44(extraout_var,iVar3);
  if ((value & 0xffffffff80000000) == 0) {
    iVar5 = io::EpsCopyOutputStream::ByteCount(&output->impl_,output->cur_);
    iVar2 = output->start_count_;
    iVar3 = (*this->_vptr_MessageLite[0xe])(this,output->cur_,output);
    output->cur_ = (uint8 *)CONCAT44(extraout_var_00,iVar3);
    ptr = io::EpsCopyOutputStream::FlushAndResetBuffer
                    (&output->impl_,(uint8 *)CONCAT44(extraout_var_00,iVar3));
    output->cur_ = ptr;
    bVar1 = (output->impl_).had_error_;
    if (bVar1 == false) {
      iVar6 = io::EpsCopyOutputStream::ByteCount(&output->impl_,ptr);
      if (value != (long)(((int)iVar2 + (int)iVar6) - ((int)iVar5 + (int)output->start_count_))) {
        iVar3 = (*this->_vptr_MessageLite[0xb])(this);
        if (value != CONCAT44(extraout_var_01,iVar3)) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message_lite.cc"
                     ,0x53);
          pLVar4 = internal::LogMessage::operator<<
                             (&local_68,
                              "CHECK failed: (byte_size_before_serialization) == (byte_size_after_serialization): "
                             );
          (*this->_vptr_MessageLite[2])(&local_88,this);
          pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_88);
          pLVar4 = internal::LogMessage::operator<<
                             (pLVar4," was modified concurrently during serialization.");
          internal::LogFinisher::operator=(&local_89,pLVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
          }
          internal::LogMessage::~LogMessage(&local_68);
        }
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message_lite.cc"
                   ,0x56);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_68,
                            "CHECK failed: (bytes_produced_by_serialization) == (byte_size_before_serialization): "
                           );
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,
                            "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
                           );
        (*this->_vptr_MessageLite[2])(&local_88,this);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_88);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,".");
        internal::LogFinisher::operator=(&local_89,pLVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        internal::LogMessage::~LogMessage(&local_68);
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message_lite.cc"
                   ,0x5b);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_68,"This shouldn\'t be called if all the sizes are equal.");
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar4);
        internal::LogMessage::~LogMessage(&local_68);
      }
    }
    bVar7 = bVar1 ^ 1;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message_lite.cc"
               ,0x15c);
    (*this->_vptr_MessageLite[2])(&local_88,this);
    pLVar4 = internal::LogMessage::operator<<(&local_68,&local_88);
    pLVar4 = internal::LogMessage::operator<<(pLVar4," exceeded maximum protobuf size of 2GB: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
    internal::LogFinisher::operator=(&local_89,pLVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    internal::LogMessage::~LogMessage(&local_68);
    bVar7 = 0;
  }
  return (bool)bVar7;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  int original_byte_count = output->ByteCount();
  SerializeWithCachedSizes(output);
  if (output->HadError()) {
    return false;
  }
  int final_byte_count = output->ByteCount();

  if (final_byte_count - original_byte_count != size) {
    ByteSizeConsistencyError(size, ByteSizeLong(),
                             final_byte_count - original_byte_count, *this);
  }

  return true;
}